

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNetwork.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::MNetwork::perform_bus_operation
          (MNetwork *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ushort uVar1;
  int offset;
  uint8_t *value_local;
  uint16_t address_local;
  BusOperation operation_local;
  MNetwork *this_local;
  
  uVar1 = address & 0x1fff;
  if ((address & 0x1000) != 0) {
    if ((uVar1 < 0x1fe0) || (0x1fe6 < uVar1)) {
      if (uVar1 == 0x1fe7) {
        this->rom_ptr_[0] = (uint8_t *)0x0;
      }
      else if ((0x1ff7 < uVar1) && (uVar1 < 0x1ffc)) {
        this->high_ram_ptr_ = this->high_ram_ + (int)((uVar1 - 0x1ff8) * 0x100);
      }
    }
    else {
      this->rom_ptr_[0] = (this->super_BusExtender).rom_base_ + (int)((uVar1 - 0x1fe0) * 0x800);
    }
    if ((address & 0x800) == 0) {
      if (this->rom_ptr_[0] == (uint8_t *)0x0) {
        if (uVar1 < 0x1400) {
          this->low_ram_[(int)(uVar1 & 0x3ff)] = *value;
        }
        else if ((int)operation < 5) {
          *value = this->low_ram_[(int)(uVar1 & 0x3ff)];
        }
      }
      else if ((int)operation < 5) {
        *value = this->rom_ptr_[0][(int)(uVar1 & 0x7ff)];
      }
    }
    else if (uVar1 < 0x1900) {
      this->high_ram_ptr_[(int)(uVar1 & 0xff)] = *value;
    }
    else if (uVar1 < 0x1a00) {
      if ((int)operation < 5) {
        *value = this->high_ram_ptr_[(int)(uVar1 & 0xff)];
      }
    }
    else if ((int)operation < 5) {
      *value = this->rom_ptr_[1][(int)(uVar1 & 0x7ff)];
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address >= 0x1fe0 && address <= 0x1fe6) {
				rom_ptr_[0] = rom_base_ + (address - 0x1fe0) * 2048;
			} else if(address == 0x1fe7) {
				rom_ptr_[0] = nullptr;
			} else if(address >= 0x1ff8 && address <= 0x1ffb) {
				int offset = (address - 0x1ff8) * 256;
				high_ram_ptr_ = &high_ram_[offset];
			}

			if(address & 0x800) {
				if(address < 0x1900) {
					high_ram_ptr_[address & 255] = *value;
				} else if(address < 0x1a00) {
					if(isReadOperation(operation)) *value = high_ram_ptr_[address & 255];
				} else {
					if(isReadOperation(operation)) *value = rom_ptr_[1][address & 2047];
				}
			} else {
				if(rom_ptr_[0]) {
					if(isReadOperation(operation)) *value = rom_ptr_[0][address & 2047];
				} else {
					if(address < 0x1400) {
						low_ram_[address & 1023] = *value;
					} else {
						if(isReadOperation(operation)) *value = low_ram_[address & 1023];
					}
				}
			}
		}